

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O2

sexp_conflict sexp_make_signal_set_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n)

{
  int iVar1;
  sigset_t *__set;
  sexp_conflict psVar2;
  sexp_gc_var_t local_30;
  sexp_conflict local_20;
  
  local_30.var = &local_20;
  local_20 = (sexp_conflict)0x43e;
  local_30.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_30;
  __set = (sigset_t *)calloc(1,0x81);
  iVar1 = sigemptyset(__set);
  if (iVar1 == 0) {
    psVar2 = (sexp_conflict)sexp_make_cpointer(ctx,(long)(self->value).type.id >> 1,__set,0x3e,1);
  }
  else {
    psVar2 = (sexp_conflict)0x3e;
  }
  (ctx->value).context.saves = local_30.next;
  return psVar2;
}

Assistant:

sexp sexp_make_signal_set_stub (sexp ctx, sexp self, sexp_sint_t n) {
  int err = 0;
  sigset_t *tmp0;
  sexp res;
  sexp_gc_var1(res0);
  sexp_gc_preserve1(ctx, res0);
  tmp0 = (sigset_t*) calloc(1, 1 + sizeof(tmp0[0]));
  err = sigemptyset(tmp0);
  if (err) {
  res = SEXP_FALSE;
  } else {
  res0 = sexp_make_cpointer(ctx, sexp_unbox_fixnum(sexp_opcode_arg1_type(self)), tmp0, SEXP_FALSE, 1);
  res = res0;
  }
  sexp_gc_release1(ctx);
  return res;
}